

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

void save_deblock_boundary_lines
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int plane,int row,int stripe,int use_highbd
               ,int is_above,RestorationStripeBoundaries *boundaries)

{
  int src_stride;
  bool bVar1;
  uint rows;
  byte bVar2;
  uint uVar3;
  ushort *puVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint16_t *buf16;
  ushort *__src;
  long lVar10;
  uint8_t *puVar11;
  undefined1 auVar12 [16];
  int local_54;
  
  uVar7 = (ulong)(0 < plane);
  puVar11 = (uint8_t *)((long)frame->store_buf_adr[(long)plane + -4] * 2);
  if (use_highbd == 0) {
    puVar11 = frame->store_buf_adr[(long)plane + -4];
  }
  src_stride = *(int *)((long)frame->store_buf_adr + uVar7 * 4 + -0x28);
  bVar2 = (byte)use_highbd;
  lVar10 = (long)(src_stride << (bVar2 & 0x1f));
  puVar11 = puVar11 + lVar10 * row;
  iVar8 = boundaries->stripe_boundary_stride << (bVar2 & 0x1f);
  __src = (ushort *)
          ((&boundaries->stripe_boundary_above)[is_above == 0] +
          (long)(stripe * iVar8 * 2) + (long)(4 << (bVar2 & 0x1f)));
  uVar9 = *(int *)((long)frame->store_buf_adr + uVar7 * 4 + -0x30) - row;
  rows = 2;
  if ((int)uVar9 < 2) {
    rows = uVar9;
  }
  if (cm->width == cm->superres_upscaled_width) {
    iVar6 = *(int *)((long)frame->store_buf_adr + uVar7 * 4 + -0x38);
    local_54 = iVar6 << (bVar2 & 0x1f);
    if ((int)uVar9 < 1) goto LAB_003a9a35;
    uVar7 = 1;
    puVar4 = __src;
    if (1 < (int)rows) {
      uVar7 = (ulong)rows;
    }
    do {
      memcpy(puVar4,puVar11,(long)local_54);
      puVar11 = puVar11 + lVar10;
      uVar7 = uVar7 - 1;
      puVar4 = (ushort *)((long)puVar4 + (long)iVar8);
    } while (uVar7 != 0);
  }
  else {
    if (plane < 1) {
      uVar3 = 0;
    }
    else {
      uVar3 = (uint)(cm->seq_params->subsampling_x != 0);
    }
    iVar6 = (int)(cm->superres_upscaled_width + uVar3) >> (sbyte)uVar3;
    local_54 = iVar6 << (bVar2 & 0x1f);
    puVar4 = __src;
    if (use_highbd != 0) {
      puVar11 = (uint8_t *)((ulong)puVar11 >> 1);
      puVar4 = (ushort *)((ulong)__src >> 1);
    }
    av1_upscale_normative_rows
              (cm,puVar11,src_stride,(uint8_t *)puVar4,boundaries->stripe_boundary_stride,plane,rows
              );
  }
  if (uVar9 == 1) {
    memcpy((byte *)((long)__src + (long)iVar8),__src,(long)local_54);
  }
LAB_003a9a35:
  bVar1 = true;
  do {
    bVar5 = bVar1;
    if (use_highbd == 0) {
      *(uint *)(__src + -2) = (uint)(byte)*__src * 0x1010101;
      *(uint *)((long)__src + (long)iVar6) =
           (uint)*(byte *)((long)__src + (long)(iVar6 + -1)) * 0x1010101;
    }
    else {
      auVar12 = pshuflw(ZEXT216(*__src),ZEXT216(*__src),0);
      *(long *)(__src + -4) = auVar12._0_8_;
      auVar12 = pshuflw(ZEXT216(__src[iVar6 + -1]),ZEXT216(__src[iVar6 + -1]),0);
      *(long *)(__src + iVar6) = auVar12._0_8_;
    }
    __src = (ushort *)((long)__src + (long)iVar8);
    bVar1 = false;
  } while (bVar5);
  return;
}

Assistant:

static void save_deblock_boundary_lines(
    const YV12_BUFFER_CONFIG *frame, const AV1_COMMON *cm, int plane, int row,
    int stripe, int use_highbd, int is_above,
    RestorationStripeBoundaries *boundaries) {
  const int is_uv = plane > 0;
  const uint8_t *src_buf = REAL_PTR(use_highbd, frame->buffers[plane]);
  const int src_stride = frame->strides[is_uv] << use_highbd;
  const uint8_t *src_rows = src_buf + row * (ptrdiff_t)src_stride;

  uint8_t *bdry_buf = is_above ? boundaries->stripe_boundary_above
                               : boundaries->stripe_boundary_below;
  uint8_t *bdry_start = bdry_buf + (RESTORATION_EXTRA_HORZ << use_highbd);
  const int bdry_stride = boundaries->stripe_boundary_stride << use_highbd;
  uint8_t *bdry_rows = bdry_start + RESTORATION_CTX_VERT * stripe * bdry_stride;

  // There is a rare case in which a processing stripe can end 1px above the
  // crop border. In this case, we do want to use deblocked pixels from below
  // the stripe (hence why we ended up in this function), but instead of
  // fetching 2 "below" rows we need to fetch one and duplicate it.
  // This is equivalent to clamping the sample locations against the crop border
  const int lines_to_save =
      AOMMIN(RESTORATION_CTX_VERT, frame->crop_heights[is_uv] - row);
  assert(lines_to_save == 1 || lines_to_save == 2);

  int upscaled_width;
  int line_bytes;
  if (av1_superres_scaled(cm)) {
    const int ss_x = is_uv && cm->seq_params->subsampling_x;
    upscaled_width = (cm->superres_upscaled_width + ss_x) >> ss_x;
    line_bytes = upscaled_width << use_highbd;
    if (use_highbd)
      av1_upscale_normative_rows(
          cm, CONVERT_TO_BYTEPTR(src_rows), frame->strides[is_uv],
          CONVERT_TO_BYTEPTR(bdry_rows), boundaries->stripe_boundary_stride,
          plane, lines_to_save);
    else
      av1_upscale_normative_rows(cm, src_rows, frame->strides[is_uv], bdry_rows,
                                 boundaries->stripe_boundary_stride, plane,
                                 lines_to_save);
  } else {
    upscaled_width = frame->crop_widths[is_uv];
    line_bytes = upscaled_width << use_highbd;
    for (int i = 0; i < lines_to_save; i++) {
      memcpy(bdry_rows + i * bdry_stride, src_rows + i * src_stride,
             line_bytes);
    }
  }
  // If we only saved one line, then copy it into the second line buffer
  if (lines_to_save == 1)
    memcpy(bdry_rows + bdry_stride, bdry_rows, line_bytes);

  extend_lines(bdry_rows, upscaled_width, RESTORATION_CTX_VERT, bdry_stride,
               RESTORATION_EXTRA_HORZ, use_highbd);
}